

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O3

VkResult __thiscall
VmaBlockVector::CommitAllocationRequest
          (VmaBlockVector *this,VmaAllocationRequest *allocRequest,VmaDeviceMemoryBlock *pBlock,
          VkDeviceSize alignment,VmaAllocationCreateFlags allocFlags,void *pUserData,
          VmaSuballocationType suballocType,VmaAllocation *pAllocation)

{
  uint32_t *puVar1;
  atomic<unsigned_long> *paVar2;
  atomic<unsigned_int> *paVar3;
  uint uVar4;
  uint32_t uVar5;
  uint uVar6;
  VmaAllocHandle pVVar7;
  VkDeviceSize VVar8;
  VmaAllocator pVVar9;
  VkResult VVar10;
  VmaAllocation pVVar11;
  int iVar12;
  bool isMappingAllowed;
  bool local_39;
  char *local_38;
  
  local_39 = (allocFlags & 0xc00) != 0;
  if ((pBlock->m_MappingHysteresis).m_ExtraMapping == 1) {
    puVar1 = &(pBlock->m_MappingHysteresis).m_MajorCounter;
    *puVar1 = *puVar1 + 1;
  }
  else {
    uVar6 = (pBlock->m_MappingHysteresis).m_MinorCounter;
    uVar4 = (pBlock->m_MappingHysteresis).m_MajorCounter;
    iVar12 = 1;
    if (uVar4 <= uVar6) {
      if (uVar4 == 0) goto LAB_001bc293;
      (pBlock->m_MappingHysteresis).m_MajorCounter = uVar4 - 1;
      iVar12 = -1;
    }
    (pBlock->m_MappingHysteresis).m_MinorCounter = iVar12 + uVar6;
  }
LAB_001bc293:
  if (((allocFlags & 4) != 0) &&
     (VVar10 = VmaDeviceMemoryBlock::Map(pBlock,this->m_hAllocator,1,(void **)0x0),
     VVar10 != VK_SUCCESS)) {
    return VVar10;
  }
  local_38 = (char *)pUserData;
  pVVar11 = VmaAllocationObjectAllocator::Allocate<bool_const&>
                      (&this->m_hAllocator->m_AllocationObjectAllocator,&local_39);
  *pAllocation = pVVar11;
  (*pBlock->m_pMetadata->_vptr_VmaBlockMetadata[0x13])
            (pBlock->m_pMetadata,allocRequest,(ulong)suballocType,pVVar11);
  pVVar11 = *pAllocation;
  pVVar7 = allocRequest->allocHandle;
  VVar8 = allocRequest->size;
  uVar5 = this->m_MemoryTypeIndex;
  pVVar11->m_Type = '\x01';
  pVVar11->m_Alignment = alignment;
  pVVar11->m_Size = VVar8;
  pVVar11->m_MemoryTypeIndex = uVar5;
  if ((allocFlags & 4) != 0) {
    pVVar11->m_Flags = pVVar11->m_Flags | 1;
  }
  pVVar11->m_SuballocationType = (uint8_t)suballocType;
  (pVVar11->field_0).m_BlockAllocation.m_Block = pBlock;
  (pVVar11->field_0).m_BlockAllocation.m_AllocHandle = pVVar7;
  if ((allocFlags & 0x20) == 0) {
    (*pAllocation)->m_pUserData = local_38;
  }
  else {
    VmaAllocation_T::SetName(*pAllocation,this->m_hAllocator,local_38);
  }
  pVVar9 = this->m_hAllocator;
  uVar6 = (pVVar9->m_MemProps).memoryTypes[this->m_MemoryTypeIndex].heapIndex;
  LOCK();
  paVar2 = (pVVar9->m_Budget).m_AllocationBytes + uVar6;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i + allocRequest->size;
  UNLOCK();
  LOCK();
  paVar3 = (pVVar9->m_Budget).m_AllocationCount + uVar6;
  (paVar3->super___atomic_base<unsigned_int>)._M_i =
       (paVar3->super___atomic_base<unsigned_int>)._M_i + 1;
  UNLOCK();
  LOCK();
  paVar3 = &(pVVar9->m_Budget).m_OperationsSinceBudgetFetch;
  (paVar3->super___atomic_base<unsigned_int>)._M_i =
       (paVar3->super___atomic_base<unsigned_int>)._M_i + 1;
  UNLOCK();
  return VK_SUCCESS;
}

Assistant:

VkResult VmaBlockVector::CommitAllocationRequest(
    VmaAllocationRequest& allocRequest,
    VmaDeviceMemoryBlock* pBlock,
    VkDeviceSize alignment,
    VmaAllocationCreateFlags allocFlags,
    void* pUserData,
    VmaSuballocationType suballocType,
    VmaAllocation* pAllocation)
{
    const bool mapped = (allocFlags & VMA_ALLOCATION_CREATE_MAPPED_BIT) != 0;
    const bool isUserDataString = (allocFlags & VMA_ALLOCATION_CREATE_USER_DATA_COPY_STRING_BIT) != 0;
    const bool isMappingAllowed = (allocFlags &
        (VMA_ALLOCATION_CREATE_HOST_ACCESS_SEQUENTIAL_WRITE_BIT | VMA_ALLOCATION_CREATE_HOST_ACCESS_RANDOM_BIT)) != 0;

    pBlock->PostAlloc();
    // Allocate from pCurrBlock.
    if (mapped)
    {
        VkResult res = pBlock->Map(m_hAllocator, 1, VMA_NULL);
        if (res != VK_SUCCESS)
        {
            return res;
        }
    }

    *pAllocation = m_hAllocator->m_AllocationObjectAllocator.Allocate(isMappingAllowed);
    pBlock->m_pMetadata->Alloc(allocRequest, suballocType, *pAllocation);
    (*pAllocation)->InitBlockAllocation(
        pBlock,
        allocRequest.allocHandle,
        alignment,
        allocRequest.size, // Not size, as actual allocation size may be larger than requested!
        m_MemoryTypeIndex,
        suballocType,
        mapped);
    VMA_HEAVY_ASSERT(pBlock->Validate());
    if (isUserDataString)
        (*pAllocation)->SetName(m_hAllocator, (const char*)pUserData);
    else
        (*pAllocation)->SetUserData(m_hAllocator, pUserData);
    m_hAllocator->m_Budget.AddAllocation(m_hAllocator->MemoryTypeIndexToHeapIndex(m_MemoryTypeIndex), allocRequest.size);
    if (VMA_DEBUG_INITIALIZE_ALLOCATIONS)
    {
        m_hAllocator->FillAllocation(*pAllocation, VMA_ALLOCATION_FILL_PATTERN_CREATED);
    }
    if (IsCorruptionDetectionEnabled())
    {
        VkResult res = pBlock->WriteMagicValueAfterAllocation(m_hAllocator, (*pAllocation)->GetOffset(), allocRequest.size);
        VMA_ASSERT(res == VK_SUCCESS && "Couldn't map block memory to write magic value.");
    }
    return VK_SUCCESS;
}